

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O3

int enet_peer_send(ENetPeer *peer,enet_uint8 channelID,ENetPacket *packet)

{
  short sVar1;
  uint uVar2;
  ENetPacket *pEVar3;
  uint uVar4;
  void *pvVar5;
  ENetOutgoingCommand *pEVar6;
  short *psVar7;
  enet_uint16 *peVar8;
  uint uVar9;
  undefined7 in_register_00000031;
  ushort uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ENetList fragments;
  undefined1 local_8d;
  ENetListNode local_80;
  ENetPacket *local_70;
  ENetProtocol local_62;
  
  if (peer->state != ENET_PEER_STATE_CONNECTED) {
    return -1;
  }
  if (peer->channelCount <= (CONCAT71(in_register_00000031,channelID) & 0xffffffff)) {
    return -1;
  }
  uVar14 = packet->dataLength;
  if (peer->host->maximumPacketSize < uVar14) {
    return -1;
  }
  psVar7 = (short *)((long)peer->channels->reliableWindows +
                    ((ulong)(uint)((int)CONCAT71(in_register_00000031,channelID) * 0x50) - 6));
  uVar11 = ((ulong)peer->mtu + (ulong)(peer->host->checksum == (ENetChecksumCallback)0x0) * 4) -
           0x22;
  if (uVar14 <= uVar11) {
    peVar8 = &local_62.acknowledge.receivedSentTime;
    if ((packet->flags & 3) == 2) {
      local_62.header.command = 'I';
    }
    else if (((packet->flags & 1) == 0) && (psVar7[1] != -1)) {
      local_62.header.command = '\a';
    }
    else {
      peVar8 = &local_62.acknowledge.receivedReliableSequenceNumber;
      local_62.header.command = 0x86;
    }
    uVar10 = (ushort)uVar14;
    *peVar8 = uVar10 << 8 | uVar10 >> 8;
    local_62.header.channelID = channelID;
    pEVar6 = enet_peer_queue_outgoing_command(peer,&local_62,packet,0,uVar10);
    return -(uint)(pEVar6 == (ENetOutgoingCommand *)0x0);
  }
  uVar4 = (uint)(((uVar14 + uVar11) - 1) / uVar11);
  if (0x100000 < uVar4) {
    return -1;
  }
  if ((packet->flags & 9) == 8) {
    sVar1 = psVar7[1];
    local_8d = 0xc;
    if (sVar1 != -1) goto LAB_00104391;
  }
  sVar1 = *psVar7;
  local_8d = 0x88;
LAB_00104391:
  enet_list_clear((ENetList *)&local_80);
  uVar14 = packet->dataLength;
  uVar13 = 0;
  if (uVar14 != 0) {
    uVar9 = 0;
    local_70 = packet;
    do {
      pvVar5 = enet_malloc(0x68);
      pEVar3 = local_70;
      if (pvVar5 == (void *)0x0) {
        while (local_80.next != &local_80) {
          pvVar5 = enet_list_remove(local_80.next);
          enet_free(pvVar5);
        }
        return -1;
      }
      if (uVar14 - uVar13 < uVar11) {
        uVar11 = uVar14 - uVar13;
      }
      uVar12 = (uint)uVar13;
      *(uint *)((long)pvVar5 + 0x20) = uVar12;
      uVar10 = (ushort)uVar11;
      *(ushort *)((long)pvVar5 + 0x24) = uVar10;
      *(ENetPacket **)((long)pvVar5 + 0x60) = local_70;
      *(undefined1 *)((long)pvVar5 + 0x28) = local_8d;
      *(enet_uint8 *)((long)pvVar5 + 0x29) = channelID;
      *(ushort *)((long)pvVar5 + 0x2c) = (sVar1 + 1U) * 0x100 | (ushort)(sVar1 + 1U) >> 8;
      *(ushort *)((long)pvVar5 + 0x2e) = uVar10 << 8 | uVar10 >> 8;
      *(uint *)((long)pvVar5 + 0x30) =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      *(uint *)((long)pvVar5 + 0x34) =
           uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      uVar2 = (uint)local_70->dataLength;
      *(uint *)((long)pvVar5 + 0x38) =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      *(uint *)((long)pvVar5 + 0x3c) =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      enet_list_insert(&local_80,pvVar5);
      uVar9 = uVar9 + 1;
      uVar13 = (ulong)(uVar12 + (int)uVar11);
      uVar14 = pEVar3->dataLength;
    } while (uVar13 < uVar14);
    uVar13 = (ulong)uVar9;
    packet = local_70;
  }
  packet->referenceCount = packet->referenceCount + uVar13;
  while (local_80.next != &local_80) {
    pEVar6 = (ENetOutgoingCommand *)enet_list_remove(local_80.next);
    enet_peer_setup_outgoing_command(peer,pEVar6);
  }
  return 0;
}

Assistant:

int
enet_peer_send (ENetPeer * peer, enet_uint8 channelID, ENetPacket * packet)
{
   ENetChannel * channel = & peer -> channels [channelID];
   ENetProtocol command;
   size_t fragmentLength;

   if (peer -> state != ENET_PEER_STATE_CONNECTED ||
       channelID >= peer -> channelCount ||
       packet -> dataLength > peer -> host -> maximumPacketSize)
     return -1;

   fragmentLength = peer -> mtu - sizeof (ENetProtocolHeader) - sizeof (ENetProtocolSendFragment);
   if (peer -> host -> checksum != NULL)
     fragmentLength -= sizeof(enet_uint32);

   if (packet -> dataLength > fragmentLength)
   {
      enet_uint32 fragmentCount = (packet -> dataLength + fragmentLength - 1) / fragmentLength,
             fragmentNumber,
             fragmentOffset;
      enet_uint8 commandNumber;
      enet_uint16 startSequenceNumber; 
      ENetList fragments;
      ENetOutgoingCommand * fragment;

      if (fragmentCount > ENET_PROTOCOL_MAXIMUM_FRAGMENT_COUNT)
        return -1;

      if ((packet -> flags & (ENET_PACKET_FLAG_RELIABLE | ENET_PACKET_FLAG_UNRELIABLE_FRAGMENT)) == ENET_PACKET_FLAG_UNRELIABLE_FRAGMENT &&
          channel -> outgoingUnreliableSequenceNumber < 0xFFFF)
      {
         commandNumber = ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE_FRAGMENT;
         startSequenceNumber = ENET_HOST_TO_NET_16 (channel -> outgoingUnreliableSequenceNumber + 1);
      }
      else
      {
         commandNumber = ENET_PROTOCOL_COMMAND_SEND_FRAGMENT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
         startSequenceNumber = ENET_HOST_TO_NET_16 (channel -> outgoingReliableSequenceNumber + 1);
      }
        
      enet_list_clear (& fragments);

      for (fragmentNumber = 0,
             fragmentOffset = 0;
           fragmentOffset < packet -> dataLength;
           ++ fragmentNumber,
             fragmentOffset += fragmentLength)
      {
         if (packet -> dataLength - fragmentOffset < fragmentLength)
           fragmentLength = packet -> dataLength - fragmentOffset;

         fragment = (ENetOutgoingCommand *) enet_malloc (sizeof (ENetOutgoingCommand));
         if (fragment == NULL)
         {
            while (! enet_list_empty (& fragments))
            {
               fragment = (ENetOutgoingCommand *) enet_list_remove (enet_list_begin (& fragments));
               
               enet_free (fragment);
            }
            
            return -1;
         }
         
         fragment -> fragmentOffset = fragmentOffset;
         fragment -> fragmentLength = fragmentLength;
         fragment -> packet = packet;
         fragment -> command.header.command = commandNumber;
         fragment -> command.header.channelID = channelID;
         fragment -> command.sendFragment.startSequenceNumber = startSequenceNumber;
         fragment -> command.sendFragment.dataLength = ENET_HOST_TO_NET_16 (fragmentLength);
         fragment -> command.sendFragment.fragmentCount = ENET_HOST_TO_NET_32 (fragmentCount);
         fragment -> command.sendFragment.fragmentNumber = ENET_HOST_TO_NET_32 (fragmentNumber);
         fragment -> command.sendFragment.totalLength = ENET_HOST_TO_NET_32 (packet -> dataLength);
         fragment -> command.sendFragment.fragmentOffset = ENET_NET_TO_HOST_32 (fragmentOffset);
        
         enet_list_insert (enet_list_end (& fragments), fragment);
      }

      packet -> referenceCount += fragmentNumber;

      while (! enet_list_empty (& fragments))
      {
         fragment = (ENetOutgoingCommand *) enet_list_remove (enet_list_begin (& fragments));
 
         enet_peer_setup_outgoing_command (peer, fragment);
      }

      return 0;
   }

   command.header.channelID = channelID;

   if ((packet -> flags & (ENET_PACKET_FLAG_RELIABLE | ENET_PACKET_FLAG_UNSEQUENCED)) == ENET_PACKET_FLAG_UNSEQUENCED)
   {
      command.header.command = ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED | ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED;
      command.sendUnsequenced.dataLength = ENET_HOST_TO_NET_16 (packet -> dataLength);
   }
   else 
   if (packet -> flags & ENET_PACKET_FLAG_RELIABLE || channel -> outgoingUnreliableSequenceNumber >= 0xFFFF)
   {
      command.header.command = ENET_PROTOCOL_COMMAND_SEND_RELIABLE | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
      command.sendReliable.dataLength = ENET_HOST_TO_NET_16 (packet -> dataLength);
   }
   else
   {
      command.header.command = ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE;
      command.sendUnreliable.dataLength = ENET_HOST_TO_NET_16 (packet -> dataLength);
   }

   if (enet_peer_queue_outgoing_command (peer, & command, packet, 0, packet -> dataLength) == NULL)
     return -1;

   return 0;
}